

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandHasWeaponPiece::Parse(CommandHasWeaponPiece *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  PClass *pPVar2;
  FName local_1c;
  
  bVar1 = FScanner::CheckToken(sc,0x102);
  if (!bVar1) {
    FScanner::MustGetToken(sc,0x101);
  }
  local_1c.Index = FName::NameManager::FindName(&FName::NameData,sc->String,true);
  pPVar2 = PClass::FindClass(&local_1c);
  this->weapon = pPVar2;
  if (pPVar2 != (PClass *)0x0) {
    if (pPVar2 == AWeapon::RegistrationInfo.MyClass) goto LAB_006007ec;
    do {
      pPVar2 = pPVar2->ParentClass;
      if (pPVar2 == AWeapon::RegistrationInfo.MyClass) break;
    } while (pPVar2 != (PClass *)0x0);
    if (pPVar2 != (PClass *)0x0) goto LAB_006007ec;
  }
  FScanner::ScriptMessage(sc,"%s is not a kind of weapon.",sc->String);
  this->weapon = AWeapon::RegistrationInfo.MyClass;
LAB_006007ec:
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x104);
  if (sc->Number < 1) {
    FScanner::ScriptError(sc,"Weapon piece number can not be less than 1.");
  }
  this->piece = sc->Number;
  SBarInfoCommandFlowControl::Parse(&this->super_SBarInfoCommandFlowControl,sc,fullScreenOffsets);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			weapon = PClass::FindClass(sc.String);
			if(weapon == NULL || !RUNTIME_CLASS(AWeapon)->IsAncestorOf(weapon)) //must be a weapon
			{
				sc.ScriptMessage("%s is not a kind of weapon.", sc.String);
				weapon = RUNTIME_CLASS(AWeapon);
			}
			sc.MustGetToken(',');
			sc.MustGetToken(TK_IntConst);
			if(sc.Number < 1)
				sc.ScriptError("Weapon piece number can not be less than 1.");
			piece = sc.Number;
			SBarInfoCommandFlowControl::Parse(sc, fullScreenOffsets);
		}